

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilityEval.cpp
# Opt level: O0

string2double * __thiscall ProbabilityEval::nextProbsSequence_abi_cxx11_(ProbabilityEval *this)

{
  bool bVar1;
  size_t sVar2;
  type pdVar3;
  reference ppVar4;
  string2double *in_RDI;
  iterator iVar5;
  char *key_1;
  iterator __end2_1;
  iterator __begin2_1;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *__range2_1;
  char *key;
  iterator __end2;
  iterator __begin2;
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *__range2;
  string seqpart;
  string2double *res;
  char in_stack_fffffffffffffe9f;
  ProbabilityEval *in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffea8;
  double dVar6;
  key_type *in_stack_fffffffffffffeb0;
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffeb8;
  key_type *in_stack_fffffffffffffef8;
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  key_type *in_stack_ffffffffffffff18;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  iterator local_a0;
  iterator local_90;
  type local_80;
  undefined1 local_75;
  undefined4 local_74;
  reference local_70;
  iterator local_68;
  iterator local_58;
  type local_48;
  undefined1 local_3d;
  
  update_cb(in_stack_fffffffffffffea0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffeb8,(size_type)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  sVar2 = robin_hood::detail::
          Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  if (sVar2 == 0) {
    local_75 = 0;
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Table((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffea0);
    local_80 = robin_hood::detail::
               Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
               ::
               operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                         (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_90 = robin_hood::detail::
               Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
               begin((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                      *)in_stack_fffffffffffffea0);
    local_a0 = robin_hood::detail::
               Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
               end((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                    *)0x10ce80);
    while( true ) {
      bVar1 = robin_hood::detail::
              Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
              Iter<false>::operator!=((Iter<false> *)&local_90,&local_a0);
      if (!bVar1) break;
      ppVar4 = robin_hood::detail::
               Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
               Iter<false>::operator*((Iter<false> *)0x10ced1);
      dVar6 = ppVar4->second;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffea0,in_stack_fffffffffffffe9f);
      in_stack_fffffffffffffea0 =
           (ProbabilityEval *)
           robin_hood::detail::
           Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]<double>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      *(double *)in_stack_fffffffffffffea0 = dVar6;
      robin_hood::detail::
      Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
      Iter<false>::operator++((Iter<false> *)in_stack_fffffffffffffea0);
    }
    local_75 = 1;
  }
  else {
    local_3d = 0;
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Table((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffea0);
    local_48 = robin_hood::detail::
               Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
               ::
               operator[]<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>>
                         (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    iVar5 = robin_hood::detail::
            Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
            begin((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                   *)in_stack_fffffffffffffea0);
    local_58 = iVar5;
    local_68 = robin_hood::detail::
               Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
               end((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                    *)0x10ccbd);
    while( true ) {
      bVar1 = robin_hood::detail::
              Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
              Iter<false>::operator!=((Iter<false> *)&local_58,&local_68);
      if (!bVar1) break;
      local_70 = robin_hood::detail::
                 Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                 ::Iter<false>::operator*((Iter<false> *)0x10cd0e);
      dVar6 = local_70->second;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffea0,in_stack_fffffffffffffe9f);
      pdVar3 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]<double>
                         ((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)iVar5.mKeyVals,(key_type *)iVar5.mInfo);
      *pdVar3 = dVar6;
      robin_hood::detail::
      Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
      Iter<false>::operator++((Iter<false> *)in_stack_fffffffffffffea0);
    }
    local_3d = 1;
  }
  local_74 = 1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0);
  return in_RDI;
}

Assistant:

string2double ProbabilityEval::nextProbsSequence() {
    update_cb();
    string seqpart = seq.substr(start);
    if (updatedDict.count(seqpart)){
        string2double res;
        for (const auto &[key, value]: updatedDict[seqpart]) {
            res[seq += key] = value;
        }
        return res;
    } else {
        string2double res;
        for (const auto &[key, value]: (*probDict)[seqpart]) {
            res[seq += key] = value;
        }
        return res;
    }
}